

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolumnview.cpp
# Opt level: O3

QRegion __thiscall
QColumnView::visualRegionForSelection(QColumnView *this,QItemSelection *selection)

{
  int iVar1;
  int iVar2;
  int iVar3;
  QAbstractItemModel *pQVar4;
  long in_RDX;
  QModelIndex *pQVar5;
  uint uVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  undefined1 auVar8 [16];
  QRegion lastRegion;
  QRegion firstRegion;
  QRegion local_a0;
  QRegion local_98;
  QModelIndex local_90;
  QModelIndex local_78;
  undefined8 local_58;
  undefined1 *puStack_50;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar6 = (uint)*(undefined8 *)(in_RDX + 0x10);
  if (uVar6 == 0) {
    pQVar5 = (QModelIndex *)&local_58;
    local_58 = (undefined1 *)0x0;
    puStack_50 = (undefined1 *)0xffffffffffffffff;
LAB_00561bc1:
    QRegion::QRegion((QRegion *)this,(QRect *)pQVar5,Rectangle);
  }
  else {
    iVar1 = QPersistentModelIndex::row();
    iVar2 = QPersistentModelIndex::row();
    if (0 < (int)uVar6) {
      uVar7 = (ulong)(uVar6 & 0x7fffffff);
      do {
        iVar3 = QPersistentModelIndex::row();
        if (iVar1 < iVar3) {
          iVar3 = iVar1;
        }
        iVar1 = iVar3;
        iVar3 = QPersistentModelIndex::row();
        if (iVar3 < iVar2) {
          iVar3 = iVar2;
        }
        iVar2 = iVar3;
        uVar7 = uVar7 - 1;
      } while (uVar7 != 0);
    }
    local_48.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    pQVar4 = QAbstractItemView::model((QAbstractItemView *)selection);
    QAbstractItemView::rootIndex(&local_78,(QAbstractItemView *)selection);
    iVar3 = iVar2;
    if (iVar1 < iVar2) {
      iVar3 = iVar1;
    }
    if (iVar2 < iVar1) {
      iVar2 = iVar1;
    }
    (**(code **)(*(long *)pQVar4 + 0x60))(&local_58,pQVar4,iVar3,0,&local_78);
    local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_78.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
    local_78.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    pQVar4 = QAbstractItemView::model((QAbstractItemView *)selection);
    QAbstractItemView::rootIndex(&local_90,(QAbstractItemView *)selection);
    (**(code **)(*(long *)pQVar4 + 0x60))(&local_78,pQVar4,iVar2,0,&local_90);
    if ((int)local_58 == local_78.r) {
      if (((local_58._4_4_ == local_78.c) && (puStack_50 == (undefined1 *)local_78.i)) &&
         (local_48.ptr == local_78.m.ptr)) {
        local_90._0_16_ =
             (**(code **)&(selection->super_QList<QItemSelectionRange>).d.d[0x1e].super_QArrayData)
                       (selection,&local_58);
        pQVar5 = &local_90;
        goto LAB_00561bc1;
      }
    }
    local_98.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
    local_90._0_16_ =
         (**(code **)&(selection->super_QList<QItemSelectionRange>).d.d[0x1e].super_QArrayData)
                   (selection,&local_58);
    QRegion::QRegion(&local_98,(QRect *)&local_90,Rectangle);
    local_a0.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
    auVar8 = (**(code **)&(selection->super_QList<QItemSelectionRange>).d.d[0x1e].super_QArrayData)
                       (selection,&local_78);
    local_90._0_16_ = auVar8;
    QRegion::QRegion(&local_a0,(QRect *)&local_90,Rectangle);
    QRegion::united((QRegion *)this);
    QRegion::~QRegion(&local_a0);
    QRegion::~QRegion(&local_98);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (QRegion)(QRegionData *)this;
}

Assistant:

QRegion QColumnView::visualRegionForSelection(const QItemSelection &selection) const
{
    int ranges = selection.size();

    if (ranges == 0)
        return QRect();

    // Note that we use the top and bottom functions of the selection range
    // since the data is stored in rows.
    int firstRow = selection.at(0).top();
    int lastRow = selection.at(0).top();
    for (int i = 0; i < ranges; ++i) {
        firstRow = qMin(firstRow, selection.at(i).top());
        lastRow = qMax(lastRow, selection.at(i).bottom());
    }

    QModelIndex firstIdx = model()->index(qMin(firstRow, lastRow), 0, rootIndex());
    QModelIndex lastIdx = model()->index(qMax(firstRow, lastRow), 0, rootIndex());

    if (firstIdx == lastIdx)
        return visualRect(firstIdx);

    QRegion firstRegion = visualRect(firstIdx);
    QRegion lastRegion = visualRect(lastIdx);
    return firstRegion.united(lastRegion);
}